

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O2

result * __thiscall
baryonyx::itm::
solve_problem<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
          (result *__return_storage_ptr__,itm *this,context *ctx,problem *pb)

{
  double cost_constant;
  long lVar1;
  long lVar2;
  unsigned_long __res;
  result_type_conflict rVar3;
  int n;
  random_engine rng;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  constraints;
  default_cost_type<long_double> cost;
  solver_functor<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::pnm_observer>
  slv;
  result local_d0;
  
  if (*(long *)(this + 0x128) != 0) {
    std::function<void_(const_baryonyx::solver_parameters_&)>::operator()
              ((function<void_(const_baryonyx::solver_parameters_&)> *)(this + 0x118),
               (solver_parameters *)this);
  }
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  lVar1 = (ctx->parameters).limit;
  lVar2 = *(long *)&(ctx->parameters).seed;
  make_merged_constraints(&constraints,(context *)this,(problem *)ctx);
  n = (int)((lVar1 - lVar2) / 0xc);
  if ((constraints.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       constraints.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (lVar1._0_4_ = (ctx->parameters).seed, lVar1._4_4_ = (ctx->parameters).thread,
     lVar1 == (ctx->parameters).limit)) {
    __return_storage_ptr__->status = success;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].value = (ctx->parameters).pushing_objective_amplifier;
  }
  else {
    rVar3 = init_random_generator_seed((context *)this);
    rng._M_x = rVar3 % 0x7fffffff + (ulong)(rVar3 % 0x7fffffff == 0);
    default_cost_type<long_double>::default_cost_type
              (&cost,(objective_function *)&(ctx->parameters).delta,n);
    cost_constant = (ctx->parameters).pushing_objective_amplifier;
    slv.m_ctx = (context *)this;
    if (*(int *)(this + 0xe4) == 1) {
      slv.m_begin.__d.__r = (duration)0;
      slv.m_end.__d.__r = (duration)0;
      slv.m_best.x.super_bit_array_impl.m_size = 0;
      slv.m_best.x.super_bit_array_impl.m_block_size = 0;
      slv.m_best.x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
      slv.m_best.value = -INFINITY;
      slv.m_best.loop = 0;
      slv.m_best.duration = 0.0;
      slv.m_best.hash = 0;
      slv.m_best.remaining_constraints = 0x7fffffff;
      slv.m_rng = &rng;
      solver_functor<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::pnm_observer>
      ::operator()(&local_d0,&slv,&constraints,n,&cost,cost_constant);
    }
    else if (*(int *)(this + 0xe4) == 2) {
      slv.m_begin.__d.__r = (duration)0;
      slv.m_end.__d.__r = (duration)0;
      slv.m_best.x.super_bit_array_impl.m_size = 0;
      slv.m_best.x.super_bit_array_impl.m_block_size = 0;
      slv.m_best.x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
      slv.m_best.value = -INFINITY;
      slv.m_best.loop = 0;
      slv.m_best.duration = 0.0;
      slv.m_best.hash = 0;
      slv.m_best.remaining_constraints = 0x7fffffff;
      slv.m_rng = &rng;
      solver_functor<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::file_observer>
      ::operator()(&local_d0,
                   (solver_functor<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::file_observer>
                    *)&slv,&constraints,n,&cost,cost_constant);
    }
    else {
      slv.m_begin.__d.__r = (duration)0;
      slv.m_end.__d.__r = (duration)0;
      slv.m_best.x.super_bit_array_impl.m_size = 0;
      slv.m_best.x.super_bit_array_impl.m_block_size = 0;
      slv.m_best.x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
      slv.m_best.value = -INFINITY;
      slv.m_best.loop = 0;
      slv.m_best.duration = 0.0;
      slv.m_best.hash = 0;
      slv.m_best.remaining_constraints = 0x7fffffff;
      slv.m_rng = &rng;
      solver_functor<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::none_observer>
      ::operator()(&local_d0,
                   (solver_functor<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::none_observer>
                    *)&slv,&constraints,n,&cost,cost_constant);
    }
    result::operator=(__return_storage_ptr__,&local_d0);
    result::~result(&local_d0);
    std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
              (&slv.m_best.x.super_bit_array_impl.m_data);
    std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::~unique_ptr
              (&cost.linear_elements);
  }
  std::__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)
             __return_storage_ptr__,
             (__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)ctx);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&__return_storage_ptr__->variable_name,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&(ctx->parameters).init_kappa_improve_increase);
  affected_variables::operator=
            (&__return_storage_ptr__->affected_vars,
             (affected_variables *)&(ctx->parameters).pushing_iteration_limit);
  __return_storage_ptr__->variables = n;
  __return_storage_ptr__->constraints =
       (index)(((long)constraints.
                      super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)constraints.
                     super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  if (*(long *)(this + 0x168) != 0) {
    std::function<void_(const_baryonyx::result_&)>::operator()
              ((function<void_(const_baryonyx::result_&)> *)(this + 0x158),__return_storage_ptr__);
  }
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector(&constraints);
  return __return_storage_ptr__;
}

Assistant:

inline result
solve_problem(const context& ctx, const problem& pb)
{
    if (ctx.start)
        ctx.start(ctx.parameters);

    result ret;

    auto variables = length(pb.vars.values);
    auto constraints{ make_merged_constraints(ctx, pb) };

    if (!constraints.empty() && !pb.vars.values.empty()) {
        random_engine rng(init_random_generator_seed(ctx));

        auto cost = Cost(pb.objective, variables);
        auto cost_constant = pb.objective.value;

        switch (ctx.parameters.observer) {
        case solver_parameters::observer_type::pnm: {
            using obs = pnm_observer;

            solver_functor<Solver, Float, Mode, Cost, obs> slv(ctx, rng);
            ret = slv(constraints, variables, cost, cost_constant);
        } break;
        case solver_parameters::observer_type::file: {
            using obs = file_observer;

            solver_functor<Solver, Float, Mode, Cost, obs> slv(ctx, rng);
            ret = slv(constraints, variables, cost, cost_constant);
        } break;
        default: {
            using obs = none_observer;

            solver_functor<Solver, Float, Mode, Cost, obs> slv(ctx, rng);
            ret = slv(constraints, variables, cost, cost_constant);
            break;
        }
        }
    } else {
        ret.status = result_status::success;
        ret.solutions.resize(1);
        ret.solutions.back().value = pb.objective.value;
    }

    ret.strings = pb.strings;
    ret.variable_name = std::move(pb.vars.names);
    ret.affected_vars = std::move(pb.affected_vars);
    ret.variables = variables;
    ret.constraints = length(constraints);

    if (ctx.finish)
        ctx.finish(ret);

    return ret;
}